

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int64_t iVar1;
  string src;
  string path;
  stringstream sstr;
  ifstream fin;
  Interpreter interpreter;
  string local_8530;
  long *local_8510;
  long local_8508;
  long local_8500 [2];
  long *local_84f0 [2];
  long local_84e0 [2];
  stringstream local_84d0 [16];
  ostream local_84c0 [112];
  ios_base local_8450 [264];
  undefined1 local_8348 [16];
  streambuf local_8338 [504];
  Interpreter local_8140;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_84f0,argv[1],(allocator<char> *)&local_8140);
  std::ifstream::ifstream(local_8348,(string *)local_84f0,_S_in);
  std::__cxx11::stringstream::stringstream(local_84d0);
  std::ostream::operator<<(local_84c0,local_8338);
  std::__cxx11::stringbuf::str();
  local_8530._M_dataplus._M_p = (pointer)&local_8530.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8530,local_8510,local_8508 + (long)local_8510);
  mocker::ir::Interpreter::Interpreter(&local_8140,&local_8530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8530._M_dataplus._M_p != &local_8530.field_2) {
    operator_delete(local_8530._M_dataplus._M_p,local_8530.field_2._M_allocated_capacity + 1);
  }
  iVar1 = mocker::ir::Interpreter::run(&local_8140);
  mocker::ir::Interpreter::~Interpreter(&local_8140);
  if (local_8510 != local_8500) {
    operator_delete(local_8510,local_8500[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_84d0);
  std::ios_base::~ios_base(local_8450);
  std::ifstream::~ifstream(local_8348);
  if (local_84f0[0] != local_84e0) {
    operator_delete(local_84f0[0],local_84e0[0] + 1);
  }
  return (int)iVar1;
}

Assistant:

int main(int argc, char **argv) {
  std::string path = argv[1];
  std::ifstream fin(path);
  std::stringstream sstr;
  sstr << fin.rdbuf();
  std::string src = sstr.str();

  mocker::ir::Interpreter interpreter(src);
  auto exitcode = interpreter.run();

#ifdef PRINT_EXITCODE
  std::cout << "=============================\nexit: " << exitcode << std::endl;
#else
  return (int)exitcode;
#endif
}